

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall vkb::SystemInfo::SystemInfo(SystemInfo *this)

{
  bool bVar1;
  VkResult VVar2;
  int iVar3;
  VulkanFunctions *pVVar4;
  iterator __first;
  iterator __last;
  reference pVVar5;
  VkResult res;
  PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion;
  VkExtensionProperties *ext_1;
  iterator __end3;
  iterator __begin3;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range3;
  __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  local_c8;
  const_iterator local_c0;
  VkResult local_b4;
  undefined1 local_b0 [4];
  VkResult layer_extensions_ret;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> layer_extensions;
  VkLayerProperties *layer_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range1_2;
  VkExtensionProperties *ext;
  iterator __end1_1;
  iterator __begin1_1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range1_1;
  VkResult local_4c;
  reference pVStack_48;
  VkResult available_extensions_ret;
  VkLayerProperties *layer;
  iterator __end1;
  iterator __begin1;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range1;
  VkResult available_layers_ret;
  SystemInfo *this_local;
  
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
            (&this->available_layers);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&this->available_extensions);
  this->validation_layers_available = false;
  this->debug_utils_available = false;
  this->instance_api_version = 0x400000;
  pVVar4 = detail::vulkan_functions();
  VVar2 = detail::get_vector<VkLayerProperties,VkResult(*&)(unsigned_int*,VkLayerProperties*)>
                    (&this->available_layers,
                     (_func_VkResult_uint_ptr_VkLayerProperties_ptr **)
                     &pVVar4->fp_vkEnumerateInstanceLayerProperties);
  if (VVar2 != VK_SUCCESS) {
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::clear
              (&this->available_layers);
  }
  __end1 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::begin
                     (&this->available_layers);
  layer = (VkLayerProperties *)
          std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::end
                    (&this->available_layers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                                     *)&layer), bVar1) {
    pVStack_48 = __gnu_cxx::
                 __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                 ::operator*(&__end1);
    iVar3 = strcmp(pVStack_48->layerName,detail::validation_layer_name);
    if (iVar3 == 0) {
      this->validation_layers_available = true;
    }
    __gnu_cxx::
    __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
    ::operator++(&__end1);
  }
  pVVar4 = detail::vulkan_functions();
  __range1_1 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0;
  local_4c = detail::
             get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),decltype(nullptr)>
                       (&this->available_extensions,
                        (_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                        &pVVar4->fp_vkEnumerateInstanceExtensionProperties,&__range1_1);
  if (local_4c != VK_SUCCESS) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::clear
              (&this->available_extensions);
  }
  __end1_1 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                       (&this->available_extensions);
  ext = (VkExtensionProperties *)
        std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                  (&this->available_extensions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                             *)&ext), bVar1) {
    pVVar5 = __gnu_cxx::
             __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
             ::operator*(&__end1_1);
    iVar3 = strcmp(pVVar5->extensionName,"VK_EXT_debug_utils");
    if (iVar3 == 0) {
      this->debug_utils_available = true;
    }
    __gnu_cxx::
    __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::begin
                       (&this->available_layers);
  layer_1 = (VkLayerProperties *)
            std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::end
                      (&this->available_layers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                             *)&layer_1), bVar1) {
    layer_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                  ::operator*(&__end1_2);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_b0);
    pVVar4 = detail::vulkan_functions();
    local_b4 = detail::
               get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),char(&)[256]>
                         ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          local_b0,(_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                                   &pVVar4->fp_vkEnumerateInstanceExtensionProperties,
                          (layer_extensions.
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->extensionName);
    if (local_b4 == VK_SUCCESS) {
      local_c8._M_current =
           (VkExtensionProperties *)
           std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                     (&this->available_extensions);
      __gnu_cxx::
      __normal_iterator<VkExtensionProperties_const*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>
      ::__normal_iterator<VkExtensionProperties*>
                ((__normal_iterator<VkExtensionProperties_const*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>
                  *)&local_c0,&local_c8);
      __first = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           local_b0);
      __last = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                         ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          local_b0);
      std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>::
      insert<__gnu_cxx::__normal_iterator<VkExtensionProperties*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>,void>
                ((vector<VkExtensionProperties,std::allocator<VkExtensionProperties>> *)
                 &this->available_extensions,local_c0,
                 (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                  )__first._M_current,
                 (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                  )__last._M_current);
      __end3 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                         ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          local_b0);
      ext_1 = (VkExtensionProperties *)
              std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                        ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                         local_b0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                         *)&ext_1), bVar1) {
        pVVar5 = __gnu_cxx::
                 __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                 ::operator*(&__end3);
        iVar3 = strcmp(pVVar5->extensionName,"VK_EXT_debug_utils");
        if (iVar3 == 0) {
          this->debug_utils_available = true;
        }
        __gnu_cxx::
        __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
        ::operator++(&__end3);
      }
    }
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_b0);
    __gnu_cxx::
    __normal_iterator<VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
    ::operator++(&__end1_2);
  }
  pVVar4 = detail::vulkan_functions();
  if ((pVVar4->fp_vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) &&
     (VVar2 = (*pVVar4->fp_vkEnumerateInstanceVersion)(&this->instance_api_version),
     VVar2 != VK_SUCCESS)) {
    this->instance_api_version = 0x400000;
  }
  return;
}

Assistant:

SystemInfo::SystemInfo() {
    auto available_layers_ret = detail::get_vector<VkLayerProperties>(
        this->available_layers, detail::vulkan_functions().fp_vkEnumerateInstanceLayerProperties);
    if (available_layers_ret != VK_SUCCESS) {
        this->available_layers.clear();
    }

    for (auto& layer : this->available_layers)
        if (strcmp(layer.layerName, detail::validation_layer_name) == 0) validation_layers_available = true;

    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        this->available_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, nullptr);
    if (available_extensions_ret != VK_SUCCESS) {
        this->available_extensions.clear();
    }

    for (auto& ext : this->available_extensions) {
        if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
            debug_utils_available = true;
        }
    }

    for (auto& layer : this->available_layers) {
        std::vector<VkExtensionProperties> layer_extensions;
        auto layer_extensions_ret = detail::get_vector<VkExtensionProperties>(
            layer_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, layer.layerName);
        if (layer_extensions_ret == VK_SUCCESS) {
            this->available_extensions.insert(
                this->available_extensions.end(), layer_extensions.begin(), layer_extensions.end());
            for (auto& ext : layer_extensions) {
                if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
                    debug_utils_available = true;
                }
            }
        }
    }

    PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

    if (pfn_vkEnumerateInstanceVersion != nullptr) {
        VkResult res = pfn_vkEnumerateInstanceVersion(&instance_api_version);
        if (res != VK_SUCCESS) {
            instance_api_version = VKB_VK_API_VERSION_1_0;
        }
    }
}